

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestRunStats::~TestRunStats(TestRunStats *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__TestRunStats_0033fdf0;
  TestRunInfo::~TestRunInfo((TestRunInfo *)0x233510);
  return;
}

Assistant:

TestRunStats::~TestRunStats() = default;